

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O0

void __thiscall tinyusdz::usda::USDAReader::Impl::RegisterPrimIdxAssignCallback(Impl *this)

{
  anon_class_8_1_8991fb9c local_38;
  PrimIdxAssignFunctin local_30;
  Impl *local_10;
  Impl *this_local;
  
  local_38.this = this;
  local_10 = this;
  ::std::function<long(long)>::
  function<tinyusdz::usda::USDAReader::Impl::RegisterPrimIdxAssignCallback()::_lambda(long)_1_,void>
            ((function<long(long)> *)&local_30,&local_38);
  ascii::AsciiParser::RegisterPrimIdxAssignFunction(&this->_parser,&local_30);
  ::std::function<long_(long)>::~function(&local_30);
  return;
}

Assistant:

void RegisterPrimIdxAssignCallback() {
    _parser.RegisterPrimIdxAssignFunction([&](const int64_t parentPrimIdx) {
      size_t idx = _prim_nodes.size();

      DCOUT("parentPrimIdx: " << parentPrimIdx << ", idx = " << idx);

      _prim_nodes.resize(idx + 1);

      // if (parentPrimIdx < 0) { // root
      //   // allocate empty prim to reserve _prim_nodes[idx]
      //   _prim_nodes.resize(idx + 1);
      //   DCOUT("resize to : " << (idx + 1));
      // }

      return idx;
    });
  }